

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O2

void Curl_bufq_skip(bufq *q,size_t amount)

{
  buf_chunk *pbVar1;
  ulong uVar2;
  size_t sVar3;
  
  while ((amount != 0 && (pbVar1 = q->head, pbVar1 != (buf_chunk *)0x0))) {
    uVar2 = pbVar1->w_offset - pbVar1->r_offset;
    if (uVar2 == 0) {
      uVar2 = 0;
    }
    else {
      if (amount <= uVar2) {
        uVar2 = amount;
      }
      sVar3 = pbVar1->r_offset + uVar2;
      pbVar1->r_offset = sVar3;
      if (sVar3 == pbVar1->w_offset) {
        pbVar1->r_offset = 0;
        pbVar1->w_offset = 0;
      }
    }
    amount = amount - uVar2;
    prune_head(q);
  }
  return;
}

Assistant:

void Curl_bufq_skip(struct bufq *q, size_t amount)
{
  size_t n;

  while(amount && q->head) {
    n = chunk_skip(q->head, amount);
    amount -= n;
    prune_head(q);
  }
}